

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

sunrealtype N_VWSqrSumLocal_Serial(N_Vector x,N_Vector w)

{
  long lVar1;
  long lVar2;
  sunrealtype sVar3;
  double dVar4;
  
  lVar1 = *x->content;
  lVar2 = 0;
  if (lVar1 < 1) {
    lVar1 = lVar2;
  }
  sVar3 = 0.0;
  for (; lVar1 != lVar2; lVar2 = lVar2 + 1) {
    dVar4 = *(double *)(*(long *)((long)x->content + 0x10) + lVar2 * 8) *
            *(double *)(*(long *)((long)w->content + 0x10) + lVar2 * 8);
    sVar3 = sVar3 + dVar4 * dVar4;
  }
  return sVar3;
}

Assistant:

sunrealtype N_VWSqrSumLocal_Serial(N_Vector x, N_Vector w)
{
  sunindextype i, N;
  sunrealtype sum, prodi, *xd, *wd;

  sum = ZERO;
  xd = wd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  wd = NV_DATA_S(w);

  for (i = 0; i < N; i++)
  {
    prodi = xd[i] * wd[i];
    sum += SUNSQR(prodi);
  }

  return (sum);
}